

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O2

double __thiscall BindPolymerase::CalculatePropensity(BindPolymerase *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  SpeciesTracker *this_00;
  double dVar4;
  
  this_00 = SpeciesTracker::Instance();
  dVar1 = (this->super_Bind).rate_constant_;
  iVar2 = SpeciesTracker::species(this_00,&(this->pol_template_).super_MobileElement.name_);
  iVar3 = SpeciesTracker::species(this_00,&(this->super_Bind).promoter_name_);
  dVar4 = (double)iVar3 * (double)iVar2 * dVar1;
  dVar1 = (this->super_Bind).super_Reaction.old_prop_;
  (this->super_Bind).super_Reaction.old_prop_ = dVar4;
  return dVar4 - dVar1;
}

Assistant:

double BindPolymerase::CalculatePropensity() {
  auto &tracker = SpeciesTracker::Instance();
  double new_prop = rate_constant_ * tracker.species(pol_template_.name()) *
                    tracker.species(promoter_name_);
  double prop_diff = new_prop - old_prop_;
  old_prop_ = new_prop;
  return prop_diff;
}